

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_byte(void)

{
  char cVar1;
  char cVar2;
  XSValue *pXVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  void *pvVar9;
  char *pcVar10;
  bool bVar11;
  Status myStatus;
  char lex_v_ran_iv_2 [5];
  char lex_v_ran_iv_1 [5];
  Status myStatus_14;
  char lex_v_ran_v_2 [5];
  char lex_v_ran_v_1 [5];
  char lex_iv_2 [8];
  char data_canrep_2 [4];
  char data_canrep_1 [4];
  char lex_v_ran_v_1_canrep [4];
  char lex_iv_1 [9];
  char lex_v_ran_v_2_canrep [5];
  char lex_v_ran_iv_2_canrep [5];
  char lex_v_ran_iv_1_canrep [4];
  char data_rawstr_2 [7];
  char data_rawstr_1 [12];
  char lex_v_ran_v_0 [10];
  StrX local_d0;
  char *local_c0;
  char local_b4 [8];
  char local_ac [8];
  Status local_a4;
  char local_a0 [8];
  char local_98 [8];
  char local_90 [12];
  char local_84 [4];
  undefined4 local_80;
  char local_7c [4];
  undefined8 local_78;
  undefined1 local_70;
  char local_6c [8];
  char local_64 [8];
  char local_5c [4];
  undefined4 local_58;
  undefined3 uStack_54;
  char local_50 [16];
  char local_40 [16];
  
  builtin_strncpy(local_40,"   12   \n",10);
  builtin_strncpy(local_98,"+127",5);
  builtin_strncpy(local_a0,"-128",5);
  builtin_strncpy(local_ac,"+128",5);
  builtin_strncpy(local_b4,"-129",5);
  builtin_strncpy(local_7c,"127",4);
  builtin_strncpy(local_6c,"-128",5);
  builtin_strncpy(local_5c,"128",4);
  builtin_strncpy(local_64,"-129",5);
  local_70 = 0;
  local_78 = 0x3635342e34333231;
  builtin_strncpy(local_90,"1234b56",8);
  builtin_strncpy(local_50,"   +123   \n",0xc);
  local_80 = 0x333231;
  uStack_54 = 0x3332;
  local_58 = 0x31303030;
  builtin_strncpy(local_84,"123",4);
  local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (cVar2 == '\0') {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8bc,local_40,local_d0.fLocalForm,1);
    StrX::~StrX(&local_d0);
    errSeen = 1;
  }
  local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (cVar2 == '\0') {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8bd,local_98,local_d0.fLocalForm,1);
    StrX::~StrX(&local_d0);
    errSeen = 1;
  }
  local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (cVar2 == '\0') {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8be,local_a0,local_d0.fLocalForm,1);
    StrX::~StrX(&local_d0);
    errSeen = 1;
  }
  local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (cVar2 == '\0') {
    if ((int)local_c0 != 6) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c1,local_ac,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_001132a3;
    }
  }
  else {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c1,local_ac,local_d0.fLocalForm,0);
LAB_001132a3:
    StrX::~StrX(&local_d0);
    errSeen = 1;
  }
  local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (cVar2 == '\0') {
    if ((int)local_c0 != 6) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c2,local_b4,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_001133a0;
    }
  }
  else {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c2,local_b4,local_d0.fLocalForm,0);
LAB_001133a0:
    StrX::~StrX(&local_d0);
    errSeen = 1;
  }
  local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (cVar2 == '\0') {
    if ((int)local_c0 != 6) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c5,&local_78,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_0011349d;
    }
  }
  else {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c5,&local_78,local_d0.fLocalForm,0);
LAB_0011349d:
    StrX::~StrX(&local_d0);
    errSeen = 1;
  }
  local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (cVar2 == '\0') {
    if ((int)local_c0 != 6) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c6,local_90,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_0011359a;
    }
  }
  else {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c6,local_90,local_d0.fLocalForm,0);
LAB_0011359a:
    StrX::~StrX(&local_d0);
    errSeen = 1;
  }
  bVar8 = true;
  do {
    local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e3,local_40);
      StrX::~StrX(&local_d0);
      errSeen = 1;
    }
    else {
      pvVar9 = (void *)(ulong)(uint)(int)(char)pXVar3[8];
      if ((int)(char)pXVar3[8] != 0xc) {
        printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",pvVar9,0xc);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e5,local_98);
      StrX::~StrX(&local_d0);
      errSeen = 1;
    }
    else {
      pvVar9 = (void *)(ulong)(uint)(int)(char)pXVar3[8];
      if ((int)(char)pXVar3[8] != 0x7f) {
        printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",pvVar9,0x7f);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e6,local_a0);
      StrX::~StrX(&local_d0);
      errSeen = 1;
    }
    else {
      pvVar9 = (void *)(ulong)(uint)(int)(char)pXVar3[8];
      if ((int)(char)pXVar3[8] != 0xffffff80) {
        printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",pvVar9,0xffffff80);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c0 != 6) {
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_c0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8e7,local_ac,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_d0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar9 = (void *)0x8e7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e7,local_ac);
      StrX::~StrX(&local_d0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c0 != 6) {
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_c0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8e8,local_b4,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_d0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar9 = (void *)0x8e8;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e8,local_b4);
      StrX::~StrX(&local_d0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c0 != 6) {
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_c0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8ea,&local_78,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_d0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar9 = (void *)0x8ea;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8ea,&local_78);
      StrX::~StrX(&local_d0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c0 != 6) {
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_c0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8eb,local_90,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_d0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar9 = (void *)0x8eb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8eb,local_90);
      StrX::~StrX(&local_d0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    bVar11 = bVar8 != false;
    bVar8 = false;
  } while (bVar11);
  bVar8 = true;
  do {
    local_a4 = st_Init;
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d0.fUnicodeForm,dt_byte,&local_a4,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x909,local_50);
      StrX::~StrX(&local_d0);
      errSeen = 1;
    }
    else {
      local_c0 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = (char *)&local_80;
      if (local_c0 != pcVar10) {
        pcVar5 = local_c0;
        if (local_c0 == (char *)0x0) {
LAB_00113d3a:
          if (*pcVar10 == '\0') goto LAB_00113d87;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00113d3a;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x909,local_50,local_d0.fLocalForm,local_c0,&local_80);
        StrX::~StrX(&local_d0);
        errSeen = 1;
      }
LAB_00113d87:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_a4 = st_Init;
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d0.fUnicodeForm,dt_byte,&local_a4,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90a,&local_58);
      StrX::~StrX(&local_d0);
      errSeen = 1;
    }
    else {
      local_c0 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_84;
      if (local_c0 != pcVar10) {
        pcVar5 = local_c0;
        if (local_c0 == (char *)0x0) {
LAB_00113e77:
          if (*pcVar10 == '\0') goto LAB_00113ec4;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00113e77;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90a,&local_58,local_d0.fLocalForm,local_c0,local_84);
        StrX::~StrX(&local_d0);
        errSeen = 1;
      }
LAB_00113ec4:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_a4 = st_Init;
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d0.fUnicodeForm,dt_byte,&local_a4,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90c,local_98);
      StrX::~StrX(&local_d0);
      errSeen = 1;
    }
    else {
      local_c0 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_7c;
      if (local_c0 != pcVar10) {
        pcVar5 = local_c0;
        if (local_c0 == (char *)0x0) {
LAB_00113fae:
          if (*pcVar10 == '\0') goto LAB_00113ff8;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00113fae;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90c,local_98,local_d0.fLocalForm,local_c0,local_7c);
        StrX::~StrX(&local_d0);
        errSeen = 1;
      }
LAB_00113ff8:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_a4 = st_Init;
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d0.fUnicodeForm,dt_byte,&local_a4,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90d,local_a0);
      StrX::~StrX(&local_d0);
      errSeen = 1;
    }
    else {
      local_c0 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_6c;
      if (local_c0 != pcVar10) {
        pcVar5 = local_c0;
        if (local_c0 == (char *)0x0) {
LAB_001140e2:
          if (*pcVar10 == '\0') goto LAB_0011412c;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_001140e2;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90d,local_a0,local_d0.fLocalForm,local_c0,local_6c);
        StrX::~StrX(&local_d0);
        errSeen = 1;
      }
LAB_0011412c:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (lVar6 == 0) {
      if ((int)local_c0 != 6) {
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_c0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x90f,&local_78,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_d0);
        goto LAB_0011423e;
      }
    }
    else {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90f,&local_78);
      StrX::~StrX(&local_d0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011423e:
      errSeen = 1;
    }
    local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
    local_d0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d0);
    if (lVar6 == 0) {
      if ((int)local_c0 != 6) {
        StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_c0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x910,local_90,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_d0);
        goto LAB_0011433e;
      }
    }
    else {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x910,local_90);
      StrX::~StrX(&local_d0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011433e:
      errSeen = 1;
    }
    bVar11 = bVar8 != false;
    bVar8 = false;
  } while (bVar11);
  local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (lVar6 == 0) {
    if ((int)local_c0 != 6) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x915,local_ac,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
      StrX::~StrX(&local_d0);
      goto LAB_00114462;
    }
  }
  else {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x915,local_ac);
    StrX::~StrX(&local_d0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00114462:
    errSeen = 1;
  }
  local_c0 = (char *)((ulong)local_c0 & 0xffffffff00000000);
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_d0.fUnicodeForm,dt_byte,(Status *)&local_c0,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (lVar6 == 0) {
    if ((int)local_c0 != 6) {
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_c0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x916,local_b4,local_d0.fLocalForm,"st_FOCA0002",pcVar10);
      StrX::~StrX(&local_d0);
      goto LAB_00114576;
    }
  }
  else {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x916,local_b4);
    StrX::~StrX(&local_d0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00114576:
    errSeen = 1;
  }
  local_a4 = st_Init;
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_d0.fUnicodeForm,dt_byte,&local_a4,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x919,local_ac);
    StrX::~StrX(&local_d0);
    errSeen = 1;
  }
  else {
    pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = local_5c;
    local_c0 = pcVar5;
    if (pcVar5 != pcVar10) {
      pcVar7 = pcVar5;
      if (pcVar5 == (char *)0x0) {
LAB_0011465b:
        if (*pcVar10 == '\0') goto LAB_001146a7;
      }
      else {
        do {
          cVar2 = *pcVar7;
          if (cVar2 == '\0') goto LAB_0011465b;
          cVar1 = *pcVar10;
          pcVar10 = pcVar10 + 1;
          pcVar7 = pcVar7 + 1;
        } while (cVar2 == cVar1);
      }
      StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x919,local_ac,local_d0.fLocalForm,pcVar5,local_5c);
      StrX::~StrX(&local_d0);
      errSeen = 1;
    }
LAB_001146a7:
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
    xercesc_4_0::XMLString::release(&local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  local_a4 = st_Init;
  local_d0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_d0.fUnicodeForm,dt_byte,&local_a4,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d0);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x91a,local_b4,local_d0.fLocalForm);
    StrX::~StrX(&local_d0);
    errSeen = 1;
    return;
  }
  pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar10 = local_64;
  local_c0 = pcVar5;
  if (pcVar5 != pcVar10) {
    pcVar7 = pcVar5;
    if (pcVar5 == (char *)0x0) {
LAB_001147a0:
      if (*pcVar10 == '\0') goto LAB_001147ec;
    }
    else {
      do {
        cVar2 = *pcVar7;
        if (cVar2 == '\0') goto LAB_001147a0;
        cVar1 = *pcVar10;
        pcVar10 = pcVar10 + 1;
        pcVar7 = pcVar7 + 1;
      } while (cVar2 == cVar1);
    }
    StrX::StrX(&local_d0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
           ,0x91a,local_b4,local_d0.fLocalForm,pcVar5,local_64);
    StrX::~StrX(&local_d0);
    errSeen = 1;
  }
LAB_001147ec:
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
  xercesc_4_0::XMLString::release(&local_c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void test_dt_byte()
{
    const XSValue::DataType dt = XSValue::dt_byte;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   12   \n";

    const char lex_v_ran_v_1[]="+127";
    const char lex_v_ran_v_2[]="-128";
    const char lex_v_ran_iv_1[]="+128";
    const char lex_v_ran_iv_2[]="-129";

    XSValue::XSValue_Data act_v_ran_v_0;   act_v_ran_v_0.fValue.f_char = (char)12;
    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_char = (char)+127;
    XSValue::XSValue_Data act_v_ran_v_2;   act_v_ran_v_2.fValue.f_char = (char)-128;

    const char lex_v_ran_v_1_canrep[]="127";
    const char lex_v_ran_v_2_canrep[]="-128";
    const char lex_v_ran_iv_1_canrep[]="128";
    const char lex_v_ran_iv_2_canrep[]="-129";

    const char lex_iv_1[]="1234.456";
    const char lex_iv_2[]="1234b56";

/***
 *
 * 3.3.19.2 Canonical representation
 *
 * The canonical representation for byte is defined by prohibiting certain options from the
 * Lexical representation (3.3.19.1). Specifically,
 * 1. the the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +123   \n";
    const char data_canrep_1[]="123";
    const char data_rawstr_2[]="000123";
    const char data_canrep_2[]="123";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,        DONT_CARE);
        CANREP_TEST(data_rawstr_2, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,        XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep, DONT_CARE);

        CANREP_TEST(lex_iv_1,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}